

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

value YAML::Utils::ComputeStringFormat
                (string *str,EMITTER_MANIP strFormat,value flowType,bool escapeNonAscii)

{
  bool bVar1;
  undefined4 in_ESI;
  string *in_RDI;
  bool in_stack_00000213;
  value in_stack_00000214;
  string *in_stack_00000218;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  value vVar2;
  
  switch(in_ESI) {
  case 0:
    bVar1 = anon_unknown_0::IsValidPlainScalar
                      (in_stack_00000218,in_stack_00000214,in_stack_00000213);
    if (bVar1) {
      vVar2 = Plain;
    }
    else {
      vVar2 = DoubleQuoted;
    }
    break;
  default:
    vVar2 = DoubleQuoted;
    break;
  case 6:
    bVar1 = anon_unknown_0::IsValidSingleQuotedScalar(in_RDI,SUB41((uint)in_ESI >> 0x18,0));
    if (bVar1) {
      vVar2 = SingleQuoted;
    }
    else {
      vVar2 = DoubleQuoted;
    }
    break;
  case 7:
    vVar2 = DoubleQuoted;
    break;
  case 8:
    bVar1 = anon_unknown_0::IsValidLiteralScalar
                      ((string *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (value)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    if (bVar1) {
      vVar2 = Literal;
    }
    else {
      vVar2 = DoubleQuoted;
    }
  }
  return vVar2;
}

Assistant:

StringFormat::value ComputeStringFormat(const std::string& str,
                                        EMITTER_MANIP strFormat,
                                        FlowType::value flowType,
                                        bool escapeNonAscii) {
  switch (strFormat) {
    case Auto:
      if (IsValidPlainScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Plain;
      }
      return StringFormat::DoubleQuoted;
    case SingleQuoted:
      if (IsValidSingleQuotedScalar(str, escapeNonAscii)) {
        return StringFormat::SingleQuoted;
      }
      return StringFormat::DoubleQuoted;
    case DoubleQuoted:
      return StringFormat::DoubleQuoted;
    case Literal:
      if (IsValidLiteralScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Literal;
      }
      return StringFormat::DoubleQuoted;
    default:
      break;
  }

  return StringFormat::DoubleQuoted;
}